

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::closeBeamlet_abi_cxx11_(Station *this,pair<int,_int> coord,int aperture,bool lside)

{
  undefined1 uVar1;
  bool bVar2;
  pair<int,_int> pVar3;
  reference pvVar4;
  reference pvVar5;
  int in_ECX;
  long in_RSI;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_RDI;
  byte in_R8B;
  pair<int,_double> pVar6;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> pVar7;
  int i_1;
  int i;
  int row;
  pair<int,_int> coord_1;
  int beam;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff;
  Station *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  Station *in_stack_fffffffffffffe88;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffe90;
  pair<int,_int> in_stack_fffffffffffffe98;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffea0;
  pair<int,_int> in_stack_fffffffffffffeb8;
  pair<int,_int> in_stack_fffffffffffffec0;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined8 in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  int local_8c;
  int local_4c;
  int local_44;
  int iStack_40;
  
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x137be2);
  pVar3.second = in_stack_fffffffffffffe84;
  pVar3.first = in_stack_fffffffffffffe80;
  getBeamIndex(in_stack_fffffffffffffe78,pVar3);
  uVar1 = isActiveBeamlet(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
  if (((bool)uVar1) &&
     (bVar2 = isOpenBeamlet(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                            in_stack_fffffffffffffe80), bVar2)) {
    pVar3 = Collimator::indexToPos
                      ((Collimator *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffef8)),
                       (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                       (int)in_stack_fffffffffffffef0);
    local_44 = pVar3.first;
    iStack_40 = pVar3.second;
    if ((in_R8B & 1) == 0) {
      local_8c = 0;
      while( true ) {
        pvVar4 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar4,(long)local_44);
        if (pvVar5->second - iStack_40 < local_8c) break;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_ECX);
        pVar6 = std::make_pair<int,double>
                          ((int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           (double *)in_stack_fffffffffffffe78);
        in_stack_fffffffffffffea0 =
             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)pVar6.second;
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        push_back(in_stack_fffffffffffffe90,(value_type *)in_stack_fffffffffffffe88);
        local_8c = local_8c + 1;
      }
      in_stack_fffffffffffffe98 =
           std::make_pair<int&,int&>((int *)in_stack_fffffffffffffe78,(int *)0x1380de);
      pvVar4 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_ECX);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                (pvVar4,(long)local_44);
      std::make_pair<std::pair<int,int>,std::pair<int,int>&>
                ((pair<int,_int> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (pair<int,_int> *)in_stack_fffffffffffffe78);
      std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::operator=
                ((pair<std::pair<int,_int>,_std::pair<int,_int>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (type)in_stack_fffffffffffffe78);
      pvVar4 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_ECX);
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar4,(long)local_44);
      if (pvVar5->first == iStack_40) {
        pvVar4 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar4,(long)local_44);
        pvVar5->first = -1;
        pvVar4 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar4,(long)local_44);
        pvVar5->second = -1;
      }
      else {
        iStack_40 = iStack_40 + -1;
        pvVar4 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar4,(long)local_44);
        pvVar5->second = iStack_40;
      }
      pVar7.second = in_stack_fffffffffffffeb8;
      pVar7.first = in_stack_fffffffffffffec0;
    }
    else {
      local_4c = 0;
      while( true ) {
        pvVar4 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar4,(long)local_44);
        if (iStack_40 - pvVar5->first < local_4c) break;
        pvVar4 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                  (pvVar4,(long)local_44);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_ECX);
        pVar6 = std::make_pair<int,double>
                          ((int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           (double *)in_stack_fffffffffffffe78);
        in_stack_fffffffffffffed8 =
             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)pVar6.second;
        in_stack_fffffffffffffee4 = pVar6.first;
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        push_back(in_stack_fffffffffffffe90,(value_type *)in_stack_fffffffffffffe88);
        local_4c = local_4c + 1;
      }
      std::make_pair<int&,int&>((int *)in_stack_fffffffffffffe78,(int *)0x137e58);
      pvVar4 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_ECX);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                (pvVar4,(long)local_44);
      pVar7 = std::make_pair<std::pair<int,int>,std::pair<int,int>&>
                        ((pair<int,_int> *)
                         CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (pair<int,_int> *)in_stack_fffffffffffffe78);
      std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::operator=
                ((pair<std::pair<int,_int>,_std::pair<int,_int>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (type)in_stack_fffffffffffffe78);
      pvVar4 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_ECX);
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar4,(long)local_44);
      if (pvVar5->second == iStack_40) {
        pvVar4 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar4,(long)local_44);
        pvVar5->first = -1;
        pvVar4 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar4,(long)local_44);
        pvVar5->second = -1;
      }
      else {
        pvVar4 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar4,(long)local_44);
        pvVar5->first = iStack_40 + 1;
      }
    }
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)pVar7.first
               ,(list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                pVar7.second);
    updateIntensity((Station *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                    in_stack_fffffffffffffed8);
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x13827a);
  }
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
            (in_stack_fffffffffffffea0,
             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             in_stack_fffffffffffffe98);
  return in_RDI;
}

Assistant:

list<pair <int,double> > Station::closeBeamlet(pair<int,int> coord, int aperture, bool lside) {
    
    list<pair <int, double> > diff;
    int beam = getBeamIndex(coord);

    //cout << "Attempt to close beam: " << beam << endl;
    //cout << "active: " << isActiveBeamlet(beam) << "open: " << isOpenBeamlet(beam, aperture) << endl;
    
    if (isActiveBeamlet(beam) && isOpenBeamlet(beam, aperture)) {
      auto coord = collimator.indexToPos(beam, angle);
      int row= coord.first;
      //cout << "Coordinates: " << coord.first << "," << coord.second << endl;
      if (lside) {
        for (int i=0; i<=coord.second-A[aperture][row].first; i++) {
          diff.push_back(make_pair(beam-(coord.second-A[aperture][row].first)+i, -intensity[aperture]));
        }
        last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
        if (A[aperture][row].second == coord.second) {
          A[aperture][row].first=-1;
          A[aperture][row].second=-1;
        } else {
          A[aperture][row].first=coord.second+1;
        }
      } else {
        for (int i=0;i<=A[aperture][row].second-coord.second;i++) {
          diff.push_back(make_pair(beam+i, -intensity[aperture]));
        }
        last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
        if (A[aperture][row].first == coord.second) {
          A[aperture][row].first=-1;
          A[aperture][row].second=-1;
        } else {
          A[aperture][row].second=coord.second-1;
        }
      }
      updateIntensity(diff);
    }

    last_diff=diff;
    return(diff);
  }